

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_mem.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  size_t sVar1;
  ulong uVar2;
  bool bVar3;
  MemoryPool pool;
  MemoryPool local_100;
  
  local_100.freeBlocks.
  super__List_base<std::pair<unsigned_char_*,_unsigned_long>,_std::allocator<std::pair<unsigned_char_*,_unsigned_long>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_100.freeBlocks;
  local_100.blockSize = 0x40000;
  local_100.totalAllocSize = 0;
  local_100.curBlockOffset = 0;
  local_100.curAllocSize = 0;
  local_100.blockPtr = (uint8_t *)0x0;
  local_100.freeBlocks.
  super__List_base<std::pair<unsigned_char_*,_unsigned_long>,_std::allocator<std::pair<unsigned_char_*,_unsigned_long>_>_>
  ._M_impl._M_node._M_size = 0;
  local_100.usedBlocks.
  super__List_base<std::pair<unsigned_char_*,_unsigned_long>,_std::allocator<std::pair<unsigned_char_*,_unsigned_long>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_100.usedBlocks;
  local_100.usedBlocks.
  super__List_base<std::pair<unsigned_char_*,_unsigned_long>,_std::allocator<std::pair<unsigned_char_*,_unsigned_long>_>_>
  ._M_impl._M_node._M_size = 0;
  local_100.freeBlocks.
  super__List_base<std::pair<unsigned_char_*,_unsigned_long>,_std::allocator<std::pair<unsigned_char_*,_unsigned_long>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       local_100.freeBlocks.
       super__List_base<std::pair<unsigned_char_*,_unsigned_long>,_std::allocator<std::pair<unsigned_char_*,_unsigned_long>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  local_100.usedBlocks.
  super__List_base<std::pair<unsigned_char_*,_unsigned_long>,_std::allocator<std::pair<unsigned_char_*,_unsigned_long>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       local_100.usedBlocks.
       super__List_base<std::pair<unsigned_char_*,_unsigned_long>,_std::allocator<std::pair<unsigned_char_*,_unsigned_long>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  phyr::MemoryPool::alloc(&local_100,4000);
  uVar2 = local_100.totalAllocSize - (local_100.totalAllocSize >> 1 & 0x5555555555555555);
  uVar2 = (uVar2 >> 2 & 0x3333333333333333) + (uVar2 & 0x3333333333333333);
  bVar3 = ((uVar2 >> 4) + uVar2 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38 < 2;
  if (bVar3) {
    phyr::MemoryPool::reset(&local_100);
    bVar3 = (local_100.totalAllocSize & local_100.totalAllocSize - 1) == 0;
  }
  sVar1 = local_100.totalAllocSize;
  if (bVar3 != false) {
    phyr::MemoryPool::alloc(&local_100,2000);
    bVar3 = sVar1 == local_100.totalAllocSize;
  }
  phyr::MemoryPool::reset(&local_100);
  phyr::MemoryPool::~MemoryPool(&local_100);
  return (uint)(bVar3 ^ 1);
}

Assistant:

int main(int argc, const char* argv[]) {
    MemoryPool pool;

    // Create an array of TestUnits
    TestUnit* units = pool.alloc<TestUnit>(100);
    // Pool size must be a power of 2
    bool valid = (pool.size() & (pool.size() - 1)) == 0;

    if (valid) {
        pool.reset();
        valid = (pool.size() & (pool.size() - 1)) == 0;
    }

    if (valid) {
        size_t poolCapacity = pool.size();
        TestUnit* newUnits = pool.alloc<TestUnit>(50);
        valid = poolCapacity == pool.size();
    }

    pool.reset();
    return valid ? 0 : 1;
}